

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ObjRetimeBwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  int iVar1;
  Rtm_Edg_t *pRVar2;
  int local_24;
  int i;
  Rtm_Edg_t *pEdge;
  Rtm_Obj_t *pObj_local;
  Rtm_Man_t *pRtm_local;
  
  iVar1 = Rtm_ObjCheckRetimeBwd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Rtm_ObjCheckRetimeBwd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRet.c"
                  ,0x225,"void Rtm_ObjRetimeBwd(Rtm_Man_t *, Rtm_Obj_t *)");
  }
  for (local_24 = 0; local_24 < pObj->nFanouts; local_24 = local_24 + 1) {
    pRVar2 = Rtm_ObjFanoutEdge(pObj,local_24);
    Rtm_ObjRemLast(pRtm,pRVar2);
  }
  for (local_24 = 0; local_24 < (int)(*(uint *)&pObj->field_0x8 >> 7 & 0xff);
      local_24 = local_24 + 1) {
    pRVar2 = Rtm_ObjEdge(pObj,local_24);
    Rtm_ObjAddFirst(pRtm,pRVar2,RTM_VAL_VOID);
  }
  return;
}

Assistant:

void Rtm_ObjRetimeBwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeBwd(pObj) );
    // extract values and compute the result
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjRemLast( pRtm, pEdge );
    // insert the result in the fanout values
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
        Rtm_ObjAddFirst( pRtm, pEdge, RTM_VAL_VOID );
}